

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
tf::SmallVectorImpl<int>::append<int_const*>(SmallVectorImpl<int> *this,int *in_start,int *in_end)

{
  ulong uVar1;
  iterator piVar2;
  iterator piVar3;
  int *in_RDX;
  type *in_RSI;
  SmallVectorTemplateCommon<int,_void> *in_RDI;
  size_type NumInputs;
  size_t in_stack_ffffffffffffffb8;
  SmallVectorTemplateCommon<int,_void> *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffd0;
  
  uVar1 = std::distance<int_const*>(in_stack_ffffffffffffffd0,(int *)in_RDI);
  piVar2 = SmallVectorTemplateCommon<int,_void>::capacity_ptr(in_RDI);
  piVar3 = SmallVectorTemplateCommon<int,_void>::end(in_RDI);
  if ((ulong)((long)piVar2 - (long)piVar3 >> 2) < uVar1) {
    SmallVectorTemplateCommon<int,_void>::size(in_stack_ffffffffffffffc0);
    SmallVectorTemplateBase<int,_true>::grow
              ((SmallVectorTemplateBase<int,_true> *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
  }
  SmallVectorTemplateCommon<int,_void>::end(in_RDI);
  SmallVectorTemplateBase<int,true>::uninitialized_copy<int_const,int>
            (piVar2,(int *)in_RDI,in_RDX,in_RSI);
  piVar2 = SmallVectorTemplateCommon<int,_void>::end(in_RDI);
  SmallVectorTemplateCommon<int,_void>::setEnd(in_RDI,piVar2 + uVar1);
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }